

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

Error __thiscall
asmjit::Assembler::_emitFailed
          (Assembler *this,Error err,uint32_t instId,uint32_t options,Operand_ *o0,Operand_ *o1,
          Operand_ *o2,Operand_ *o3)

{
  Error EVar1;
  char *str;
  anon_union_16_7_ed616b9d_for_Operand__0 local_1b8;
  UInt64 local_1a8;
  anon_union_8_2_78723da6_for_MemData_2 aStack_1a0;
  UInt64 local_198;
  anon_union_8_2_78723da6_for_MemData_2 aStack_190;
  UInt64 local_188;
  anon_union_8_2_78723da6_for_MemData_2 aStack_180;
  UInt64 local_178;
  anon_union_8_2_78723da6_for_MemData_2 aStack_170;
  UInt64 local_168;
  anon_union_8_2_78723da6_for_MemData_2 aStack_160;
  StringBuilderTmp<256UL> sb;
  
  sb.super_StringBuilder._data = sb._embeddedData;
  sb._embeddedData[0] = '\0';
  sb.super_StringBuilder._length = 0;
  sb.super_StringBuilder._capacity = 0x100;
  sb.super_StringBuilder._canFree = 0;
  str = DebugUtils::errorAsString(err);
  StringBuilder::_opString(&sb.super_StringBuilder,1,str,0xffffffffffffffff);
  StringBuilder::_opString(&sb.super_StringBuilder,1,": ",0xffffffffffffffff);
  local_1b8._packed[0].field_10 = (o0->field_0)._packed[0];
  local_1b8._mem.field_2 = (o0->field_0)._mem.field_2;
  local_1a8 = (o1->field_0)._packed[0];
  aStack_1a0 = (o1->field_0)._mem.field_2;
  local_198 = (o2->field_0)._packed[0];
  aStack_190 = (o2->field_0)._mem.field_2;
  local_188 = (o3->field_0)._packed[0];
  aStack_180 = (o3->field_0)._mem.field_2;
  if ((options & 8) == 0) {
    local_168.i64 = 0;
    aStack_160.offset64 = 0;
    local_178.i64 = 0;
    aStack_170.offset64 = 0;
  }
  else {
    local_178 = (this->_op4).field_0._packed[0];
    aStack_170 = (this->_op4).field_0._mem.field_2;
    local_168 = (this->_op5).field_0._packed[0];
    aStack_160 = (this->_op5).field_0._mem.field_2;
  }
  Logging::formatInstruction
            (&sb.super_StringBuilder,0,&this->super_CodeEmitter,
             (uint)(this->super_CodeEmitter)._codeInfo._archInfo.field_0.field_0._type,instId,
             options,&(this->super_CodeEmitter)._extraOp,(Operand_ *)&local_1b8._any,6);
  *(undefined8 *)&(this->super_CodeEmitter)._options = 0;
  *(undefined8 *)((long)&(this->super_CodeEmitter)._inlineComment + 4) = 0;
  EVar1 = CodeEmitter::setLastError(&this->super_CodeEmitter,err,sb.super_StringBuilder._data);
  StringBuilder::~StringBuilder(&sb.super_StringBuilder);
  return EVar1;
}

Assistant:

Error Assembler::_emitFailed(
  Error err,
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {

  StringBuilderTmp<256> sb;
  sb.appendString(DebugUtils::errorAsString(err));
  sb.appendString(": ");

  Operand_ opArray[6];
  opArray[0].copyFrom(o0);
  opArray[1].copyFrom(o1);
  opArray[2].copyFrom(o2);
  opArray[3].copyFrom(o3);

  if (options & kOptionOp4Op5Used) {
    opArray[4].copyFrom(_op4);
    opArray[5].copyFrom(_op5);
  }
  else {
    opArray[4].reset();
    opArray[5].reset();
  }

  Logging::formatInstruction(
    sb, 0,
    this, getArchType(),
    instId, options, _extraOp, opArray, 6);

  resetOptions();
  resetExtraOp();
  resetInlineComment();
  return setLastError(err, sb.getData());
}